

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O3

int getsym_op(void)

{
  byte bVar1;
  ushort **ppuVar2;
  __int32_t **pp_Var3;
  int iVar4;
  long lVar5;
  byte *pbVar6;
  byte bVar7;
  
  pbVar6 = expr;
  bVar1 = *expr;
  ppuVar2 = __ctype_b_loc();
  lVar5 = 0;
  bVar7 = bVar1;
  while( true ) {
    pbVar6 = pbVar6 + 1;
    iVar4 = (int)lVar5;
    if ((((((*ppuVar2)[(char)bVar7] >> 10 & 1) == 0) &&
         ((0x31 < bVar7 - 0x2e || ((0x2000000040001U >> ((ulong)(bVar7 - 0x2e) & 0x3f) & 1) == 0))))
        && ((((*ppuVar2)[(char)bVar7] >> 0xb & 1) == 0 || (iVar4 < 1)))) &&
       (((bVar1 != 0x40 && (bVar1 != 0x2e)) || ((bVar7 != 0x2d && (bVar7 != 0x2b)))))) break;
    if (iVar4 < 0x3f) {
      symbol[(long)iVar4 + 1] = bVar7;
      lVar5 = (long)iVar4 + 1;
    }
    bVar7 = *pbVar6;
    expr = pbVar6;
  }
  if (iVar4 == 1) {
    pp_Var3 = __ctype_toupper_loc();
    iVar4 = 1;
    if (((*pp_Var3)[symbol[1]] - 0x41U < 0x19) &&
       ((0x1800001U >> ((*pp_Var3)[symbol[1]] - 0x41U & 0x1f) & 1) != 0)) {
      error("Symbol is reserved (A, X or Y)!");
      iVar4 = 0;
    }
  }
  symbol[0] = (char)iVar4;
  symbol[(long)iVar4 + 1] = '\0';
  return iVar4;
}

Assistant:

int
getsym_op(void)
{
	int	valid;
	int	i;
	char c;
	char local_check;

	valid = 1;
	i = 0;

	/* get the symbol, stop to the first 'non symbol' char */
	local_check = *expr;
	while (valid) {
		c = *expr;
		if (isalpha(c) || c == '_' || c == '.' || c == '@' || (isdigit(c) && i >= 1)) {
			if (i < SBOLSZ - 1)
				symbol[++i] = c;
			expr++;
		}
		else if((local_check=='.' || local_check=='@') && ((c=='-') || (c=='+'))) {
                if (i < SBOLSZ - 1)
                    symbol[++i] = c;
                expr++;
             }
            else {
                valid = 0;
            }
	}

	/* is it a reserved symbol? */
	if (i == 1) {
		switch (toupper(symbol[1])) {
		case 'A':
		case 'X':
		case 'Y':
			error("Symbol is reserved (A, X or Y)!");
			i = 0;
		}
	}

	/* store symbol length */
	symbol[0] = i;
	symbol[i+1] = '\0';
	return (i);
}